

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

SASL_RESPONSE_HANDLE sasl_response_clone(SASL_RESPONSE_HANDLE value)

{
  SASL_RESPONSE_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (SASL_RESPONSE_HANDLE)malloc(8);
  if (__ptr != (SASL_RESPONSE_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (SASL_RESPONSE_HANDLE)0x0;
}

Assistant:

SASL_RESPONSE_HANDLE sasl_response_clone(SASL_RESPONSE_HANDLE value)
{
    SASL_RESPONSE_INSTANCE* sasl_response_instance = (SASL_RESPONSE_INSTANCE*)malloc(sizeof(SASL_RESPONSE_INSTANCE));
    if (sasl_response_instance != NULL)
    {
        sasl_response_instance->composite_value = amqpvalue_clone(((SASL_RESPONSE_INSTANCE*)value)->composite_value);
        if (sasl_response_instance->composite_value == NULL)
        {
            free(sasl_response_instance);
            sasl_response_instance = NULL;
        }
    }

    return sasl_response_instance;
}